

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

Status __thiscall
wallet::MockableCursor::Next(MockableCursor *this,DataStream *key,DataStream *value)

{
  long lVar1;
  _Base_ptr p_Var2;
  pointer pbVar3;
  Status SVar4;
  size_t in_RCX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SVar4 = FAIL;
  if (this->m_pass == true) {
    p_Var2 = (this->m_cursor)._M_node;
    if (p_Var2 == (this->m_cursor_end)._M_node) {
      SVar4 = DONE;
    }
    else {
      pbVar3 = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish != pbVar3) {
        (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish = pbVar3;
      }
      key->m_read_pos = 0;
      pbVar3 = (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish != pbVar3) {
        (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish = pbVar3;
      }
      value->m_read_pos = 0;
      DataStream::write(key,(int)*(long *)(p_Var2 + 1),
                        (void *)((long)p_Var2[1]._M_parent - *(long *)(p_Var2 + 1)),in_RCX);
      DataStream::write(value,(int)p_Var2[1]._M_right,
                        (void *)(*(long *)(p_Var2 + 2) - (long)p_Var2[1]._M_right),in_RCX);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
      ::operator++(&this->m_cursor,0);
      SVar4 = MORE;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return SVar4;
}

Assistant:

DatabaseCursor::Status MockableCursor::Next(DataStream& key, DataStream& value)
{
    if (!m_pass) {
        return Status::FAIL;
    }
    if (m_cursor == m_cursor_end) {
        return Status::DONE;
    }
    key.clear();
    value.clear();
    const auto& [key_data, value_data] = *m_cursor;
    key.write(key_data);
    value.write(value_data);
    m_cursor++;
    return Status::MORE;
}